

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O0

QString * __thiscall QTemporaryDir::filePath(QTemporaryDir *this,QString *fileName)

{
  bool bVar1;
  char *pcVar2;
  QString *in_RDX;
  long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *ret;
  QString *in_stack_ffffffffffffff58;
  QString *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  QMessageLogger *this_00;
  QChar c;
  uint in_stack_ffffffffffffff70;
  QChar local_42 [13];
  QMessageLogger local_28;
  long local_8;
  
  c.ucs = (char16_t)((ulong)in_stack_ffffffffffffff68 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QDir::isAbsolutePath((QString *)0x2f6ffc);
  if (bVar1) {
    this_00 = &local_28;
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)(ulong)in_stack_ffffffffffffff70,(char *)this_00,
               (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(char *)in_stack_ffffffffffffff58);
    QtPrivate::asString(in_RDX);
    QString::toUtf8(in_stack_ffffffffffffff58);
    pcVar2 = QByteArray::constData((QByteArray *)0x2f7048);
    QMessageLogger::warning
              (this_00,"QTemporaryDir::filePath: Absolute paths are not allowed: %s",pcVar2);
    QByteArray::~QByteArray((QByteArray *)0x2f706c);
    QString::QString((QString *)0x2f7076);
  }
  else if ((*(byte *)(*in_RSI + 0x19) & 1) == 0) {
    QString::QString((QString *)0x2f70b4);
  }
  else {
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    bVar1 = QString::isEmpty((QString *)0x2f70fa);
    if (!bVar1) {
      QChar::QChar<char16_t,_true>(local_42,L'/');
      QString::operator+=(in_stack_ffffffffffffff60,c);
      QString::operator+=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QTemporaryDir::filePath(const QString &fileName) const
{
    if (QDir::isAbsolutePath(fileName)) {
        qWarning("QTemporaryDir::filePath: Absolute paths are not allowed: %s", qUtf8Printable(fileName));
        return QString();
    }

    if (!d_ptr->success)
        return QString();

    QString ret = d_ptr->pathOrError;
    if (!fileName.isEmpty()) {
        ret += u'/';
        ret += fileName;
    }
    return ret;
}